

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_proxy_revoke(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                       JSValue *func_data)

{
  JSValue v;
  JSValue JVar1;
  void *pvVar2;
  undefined4 in_R9D;
  JSValue *in_stack_00000008;
  JSProxyData *s;
  uint uStackY_54;
  JSContext *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint uStack_c;
  
  pvVar2 = JS_GetOpaque(*in_stack_00000008,0x29);
  if (pvVar2 != (void *)0x0) {
    *(undefined1 *)((long)pvVar2 + 0x21) = 1;
    v.tag._0_4_ = in_stack_ffffffffffffffc0;
    v.u.ptr = pvVar2;
    v.tag._4_4_ = in_R9D;
    JS_FreeValue(in_stack_ffffffffffffffb0,v);
    (in_stack_00000008->u).ptr = (void *)((ulong)uStackY_54 << 0x20);
    in_stack_00000008->tag = 2;
  }
  JVar1.tag = 3;
  JVar1.u.ptr = (void *)((ulong)uStack_c << 0x20);
  return JVar1;
}

Assistant:

static JSValue js_proxy_revoke(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int magic,
                               JSValue *func_data)
{
    JSProxyData *s = JS_GetOpaque(func_data[0], JS_CLASS_PROXY);
    if (s) {
        /* We do not free the handler and target in case they are
           referenced as constants in the C call stack */
        s->is_revoked = TRUE;
        JS_FreeValue(ctx, func_data[0]);
        func_data[0] = JS_NULL;
    }
    return JS_UNDEFINED;
}